

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

void cp_decl_func(CPState *cp,CPDecl *fdecl)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  CTypeID CVar4;
  bool bVar5;
  CPDecl *pCVar6;
  CTypeID CVar7;
  CTypeID CVar8;
  CPDeclIdx CVar9;
  int iVar10;
  CTypeID CVar11;
  CTInfo info;
  uint uVar12;
  uint uVar13;
  CType *ct;
  CPDecl decl;
  CTSize local_9e8;
  CType *local_9e0;
  CPDecl *local_9d8;
  CPDecl local_9d0;
  
  local_9d8 = fdecl;
  if (cp->tok != 0x29) {
    uVar13 = 0;
    uVar12 = 0x60000000;
    CVar11 = 0;
    local_9e8 = 0;
    do {
      if (cp->tok == 0x2e) {
        cp_next(cp);
        cp_check(cp,0x2e);
        cp_check(cp,0x2e);
        uVar12 = uVar12 | 0x800000;
        bVar5 = false;
      }
      else {
        cp_decl_spec(cp,&local_9d0,0x80000);
        local_9d0.mode = 6;
        cp_declarator(cp,&local_9d0);
        CVar7 = cp_decl_intern(cp,&local_9d0);
        local_9e0 = cp->cts->tab;
        uVar3 = local_9e0[CVar7].info;
        local_9e0 = local_9e0 + CVar7;
        if (uVar3 >> 0x1c == 4) {
          bVar5 = false;
        }
        else {
          if ((uVar3 & 0xfc000000) == 0x30000000) {
            info = uVar3 & 0xffff | 0x20030000;
LAB_001520ae:
            CVar7 = lj_ctype_intern(cp->cts,info,8);
          }
          else if (uVar3 >> 0x1c == 6) {
            info = (CVar7 | 0x30000) + 0x20000000;
            goto LAB_001520ae;
          }
          CVar8 = lj_ctype_new(cp->cts,&local_9e0);
          CVar4 = CVar8;
          if (CVar11 != 0) {
            cp->cts->tab[uVar13].sib = (CTypeID1)CVar8;
            CVar4 = CVar11;
          }
          if (local_9d0.name != (GCstr *)0x0) {
            (local_9d0.name)->marked = (local_9d0.name)->marked | 0x20;
            (local_9e0->name).gcptr64 = (uint64_t)local_9d0.name;
          }
          local_9e0->info = CVar7 + 0x90000000;
          local_9e0->size = local_9e8;
          local_9e8 = local_9e8 + 1;
          bVar5 = true;
          uVar13 = CVar8;
          CVar11 = CVar4;
        }
      }
      if ((!bVar5) || (cp->tok != 0x2c)) goto LAB_00151f62;
      cp_next(cp);
    } while( true );
  }
  CVar11 = 0;
  uVar12 = 0x60000000;
  local_9e8 = 0;
LAB_00151f62:
  cp_check(cp,0x29);
  if (cp->tok == 0x7b) {
    cp_next(cp);
    *(byte *)&cp->mode = (byte)cp->mode | 0x20;
    iVar10 = 1;
    do {
      iVar2 = cp->tok;
      if (iVar2 == 0x7d) {
        iVar10 = iVar10 + -1;
        if (iVar10 == 0) {
          *(byte *)&cp->mode = (byte)cp->mode & 0xdf;
          cp->tok = 0x3b;
          break;
        }
LAB_00151fa6:
        if (iVar2 == 0x103) {
          cp_err_token(cp,0x7d);
        }
      }
      else {
        if (iVar2 != 0x7b) goto LAB_00151fa6;
        iVar10 = iVar10 + 1;
      }
      cp_next(cp);
    } while( true );
  }
  pCVar6 = local_9d8;
  uVar1 = *(ushort *)((long)&local_9d8->fattr + 2);
  local_9d8->fattr = 0;
  CVar9 = cp_add(local_9d8,(uint)uVar1 << 0x10 | uVar12,local_9e8);
  pCVar6->stack[CVar9].sib = (CTypeID1)CVar11;
  return;
}

Assistant:

static void cp_decl_func(CPState *cp, CPDecl *fdecl)
{
  CTSize nargs = 0;
  CTInfo info = CTINFO(CT_FUNC, 0);
  CTypeID lastid = 0, anchor = 0;
  if (cp->tok != ')') {
    do {
      CPDecl decl;
      CTypeID ctypeid, fieldid;
      CType *ct;
      if (cp_opt(cp, '.')) {  /* Vararg function. */
	cp_check(cp, '.');  /* Workaround for the minimalistic lexer. */
	cp_check(cp, '.');
	info |= CTF_VARARG;
	break;
      }
      cp_decl_spec(cp, &decl, CDF_REGISTER);
      decl.mode = CPARSE_MODE_DIRECT|CPARSE_MODE_ABSTRACT;
      cp_declarator(cp, &decl);
      ctypeid = cp_decl_intern(cp, &decl);
      ct = ctype_raw(cp->cts, ctypeid);
      if (ctype_isvoid(ct->info))
	break;
      else if (ctype_isrefarray(ct->info))
	ctypeid = lj_ctype_intern(cp->cts,
	  CTINFO(CT_PTR, CTALIGN_PTR|ctype_cid(ct->info)), CTSIZE_PTR);
      else if (ctype_isfunc(ct->info))
	ctypeid = lj_ctype_intern(cp->cts,
	  CTINFO(CT_PTR, CTALIGN_PTR|ctypeid), CTSIZE_PTR);
      /* Add new parameter. */
      fieldid = lj_ctype_new(cp->cts, &ct);
      if (anchor)
	ctype_get(cp->cts, lastid)->sib = fieldid;
      else
	anchor = fieldid;
      lastid = fieldid;
      if (decl.name) ctype_setname(ct, decl.name);
      ct->info = CTINFO(CT_FIELD, ctypeid);
      ct->size = nargs++;
    } while (cp_opt(cp, ','));
  }
  cp_check(cp, ')');
  if (cp_opt(cp, '{')) {  /* Skip function definition. */
    int level = 1;
    cp->mode |= CPARSE_MODE_SKIP;
    for (;;) {
      if (cp->tok == '{') level++;
      else if (cp->tok == '}' && --level == 0) break;
      else if (cp->tok == CTOK_EOF) cp_err_token(cp, '}');
      cp_next(cp);
    }
    cp->mode &= ~CPARSE_MODE_SKIP;
    cp->tok = ';';  /* Ok for cp_decl_multi(), error in cp_decl_single(). */
  }
  info |= (fdecl->fattr & ~CTMASK_CID);
  fdecl->fattr = 0;
  fdecl->stack[cp_add(fdecl, info, nargs)].sib = anchor;
}